

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>,_unsigned_long>,_std::hash<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::pair<const_std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>_>
::set_ctrl(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>,_unsigned_long>,_std::hash<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::pair<const_std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>_>
           *this,size_t i,ctrl_t h)

{
  if (i < this->capacity_) {
    this->ctrl_[i] = h;
    this->ctrl_[(ulong)((uint)this->capacity_ & 0xf) + 1 + (i - 0x10 & this->capacity_)] = h;
    return;
  }
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SchrodingerZhu[P]backend/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x840,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>, unsigned long>, std::hash<std::shared_ptr<vmips::VirtReg>>, phmap::priv::HashEq<vmips::VirtReg *>::Eq, std::allocator<std::pair<const std::shared_ptr<vmips::VirtReg>, unsigned long>>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>, unsigned long>, Hash = std::hash<std::shared_ptr<vmips::VirtReg>>, Eq = phmap::priv::HashEq<vmips::VirtReg *>::Eq, Alloc = std::allocator<std::pair<const std::shared_ptr<vmips::VirtReg>, unsigned long>>]"
               );
}

Assistant:

void set_ctrl(size_t i, ctrl_t h) {
        assert(i < capacity_);

        if (IsFull(h)) {
            SanitizerUnpoisonObject(slots_ + i);
        } else {
            SanitizerPoisonObject(slots_ + i);
        }

        ctrl_[i] = h;
        ctrl_[((i - Group::kWidth) & capacity_) + 1 +
              ((Group::kWidth - 1) & capacity_)] = h;
    }